

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Path::resolve(Path *this,Value *root)

{
  char *key;
  Value *pVVar1;
  undefined1 *this_00;
  PathArgument *arg;
  pointer pPVar2;
  
  pPVar2 = (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (undefined1 *)root;
  if (pPVar2 != (this->args_).
                super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      if (pPVar2->kind_ == kindKey) {
        key = (pPVar2->key_)._M_dataplus._M_p;
        pVVar1 = Value::find((Value *)this_00,key,key + (pPVar2->key_)._M_string_length);
        this_00 = kNull;
        if (pVVar1 != (Value *)0x0) goto LAB_00141d5d;
      }
      else if (pPVar2->kind_ == kindIndex) {
        if (((Value *)this_00)->field_0x8 == '\x06') {
          Value::size((Value *)this_00);
        }
        pVVar1 = Value::operator[]((Value *)this_00,pPVar2->index_);
LAB_00141d5d:
        this_00 = (undefined1 *)pVVar1;
      }
      pPVar2 = pPVar2 + 1;
      root = (Value *)this_00;
    } while (pPVar2 != (this->args_).
                       super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  return root;
}

Assistant:

const Value& Path::resolve(const Value& root) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_)) {
        // Error: unable to resolve path (array value expected at position...
      }
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject()) {
        // Error: unable to resolve path (object value expected at position...)
      }
      node = &((*node)[arg.key_]);
      if (node == &Value::nullRef) {
        // Error: unable to resolve path (object has no member named '' at
        // position...)
      }
    }
  }
  return *node;
}